

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastCallback.cpp
# Opt level: O0

void __thiscall
btTriangleConvexcastCallback::processTriangle
          (btTriangleConvexcastCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  btTransform *in_RSI;
  btVoronoiSimplexSolver *in_RDI;
  btScalar bVar2;
  CastResult castResult;
  btContinuousConvexCollision convexCaster;
  btGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;
  btVoronoiSimplexSolver simplexSolver;
  btTriangleShape triangleShape;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 uVar3;
  btConvexInternalShape *this_00;
  btConvexShape *in_stack_fffffffffffffcf8;
  btContinuousConvexCollision *in_stack_fffffffffffffd00;
  btVector3 *in_stack_fffffffffffffd08;
  btVector3 *in_stack_fffffffffffffd10;
  btVector3 *in_stack_fffffffffffffd18;
  btVoronoiSimplexSolver *in_stack_fffffffffffffd20;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  float local_260;
  btScalar local_250;
  btConvexInternalShape local_98;
  CastResult *in_stack_ffffffffffffffd0;
  btTransform *in_stack_ffffffffffffffd8;
  btTransform *in_stack_ffffffffffffffe0;
  btVoronoiSimplexSolver *this_01;
  
  this_00 = &local_98;
  this_01 = in_RDI;
  btTriangleShape::btTriangleShape
            ((btTriangleShape *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  btConvexInternalShape::setMargin(this_00,in_RDI->m_simplexPointsQ[3].m_floats[0]);
  btVoronoiSimplexSolver::btVoronoiSimplexSolver(in_stack_fffffffffffffd20);
  btGjkEpaPenetrationDepthSolver::btGjkEpaPenetrationDepthSolver
            ((btGjkEpaPenetrationDepthSolver *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  btContinuousConvexCollision::btContinuousConvexCollision
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,&this_00->super_btConvexShape,
             in_RDI,(btConvexPenetrationDepthSolver *)
                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  btConvexCast::CastResult::CastResult
            ((CastResult *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  local_260 = 1.0;
  local_250 = in_RDI->m_simplexPointsQ[3].m_floats[1];
  bVar1 = btContinuousConvexCollision::calcTimeOfImpact
                    ((btContinuousConvexCollision *)this_01,in_RSI,
                     (btTransform *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe0,
                     in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffce4);
  if (((bVar1) && (bVar2 = btVector3::length2((btVector3 *)0x1ee279), 0.0001 < bVar2)) &&
     (local_260 < in_RDI->m_simplexPointsQ[2].m_floats[3])) {
    btVector3::normalize((btVector3 *)CONCAT44(uVar3,bVar2));
    (**(code **)(*(long *)in_RDI + 0x18))(local_260,in_RDI,local_280,local_270,in_EDX,in_ECX);
  }
  btConvexCast::CastResult::~CastResult((CastResult *)&stack0xfffffffffffffcf8);
  btContinuousConvexCollision::~btContinuousConvexCollision((btContinuousConvexCollision *)0x1ee383)
  ;
  btGjkEpaPenetrationDepthSolver::~btGjkEpaPenetrationDepthSolver
            ((btGjkEpaPenetrationDepthSolver *)0x1ee390);
  btTriangleShape::~btTriangleShape((btTriangleShape *)0x1ee39d);
  return;
}

Assistant:

void
btTriangleConvexcastCallback::processTriangle (btVector3* triangle, int partId, int triangleIndex)
{
	btTriangleShape triangleShape (triangle[0], triangle[1], triangle[2]);
    triangleShape.setMargin(m_triangleCollisionMargin);

	btVoronoiSimplexSolver	simplexSolver;
	btGjkEpaPenetrationDepthSolver	gjkEpaPenetrationSolver;

//#define  USE_SUBSIMPLEX_CONVEX_CAST 1
//if you reenable USE_SUBSIMPLEX_CONVEX_CAST see commented out code below
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
	btSubsimplexConvexCast convexCaster(m_convexShape, &triangleShape, &simplexSolver);
#else
	//btGjkConvexCast	convexCaster(m_convexShape,&triangleShape,&simplexSolver);
	btContinuousConvexCollision convexCaster(m_convexShape,&triangleShape,&simplexSolver,&gjkEpaPenetrationSolver);
#endif //#USE_SUBSIMPLEX_CONVEX_CAST
	
	btConvexCast::CastResult castResult;
	castResult.m_fraction = btScalar(1.);
	castResult.m_allowedPenetration = m_allowedPenetration;
	if (convexCaster.calcTimeOfImpact(m_convexShapeFrom,m_convexShapeTo,m_triangleToWorld, m_triangleToWorld, castResult))
	{
		//add hit
		if (castResult.m_normal.length2() > btScalar(0.0001))
		{					
			if (castResult.m_fraction < m_hitFraction)
			{
/* btContinuousConvexCast's normal is already in world space */
/*
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
				//rotate normal into worldspace
				castResult.m_normal = m_convexShapeFrom.getBasis() * castResult.m_normal;
#endif //USE_SUBSIMPLEX_CONVEX_CAST
*/
				castResult.m_normal.normalize();

				reportHit (castResult.m_normal,
							castResult.m_hitPoint,
							castResult.m_fraction,
							partId,
							triangleIndex);
			}
		}
	}
}